

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O0

double alex::fanout_tree::compute_level<int,int,alex::AlexCompare>
                 (undefined8 param_1,long param_2,int param_3,long param_4,int param_5,
                 value_type *param_6,undefined4 param_7,int param_8,byte param_9,byte param_10)

{
  pair<int,_int> *ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double traversal_cost;
  double node_cost;
  DataNodeStats stats;
  LinearModel<int> model;
  int i;
  int right_boundary;
  int left_boundary;
  double b;
  double a;
  double cost;
  int fanout;
  value_type *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 uVar6;
  int local_158;
  double local_f0;
  undefined1 in_stack_ffffffffffffff1f;
  LinearModel<int> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  V *in_stack_ffffffffffffff30;
  undefined4 local_c8;
  int local_c4;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff57;
  LinearModel<int> *in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  V *in_stack_ffffffffffffff78;
  double local_78;
  int local_6c;
  int local_68;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  int local_48;
  byte local_42;
  byte local_41;
  undefined8 local_40;
  undefined4 local_34;
  value_type *local_30;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  
  local_41 = param_9 & 1;
  local_42 = param_10 & 1;
  local_48 = 1 << ((byte)param_7 & 0x1f);
  local_50 = 0.0;
  local_58 = *(double *)(param_4 + 0x10) * (double)local_48;
  local_60 = *(double *)(param_4 + 0x18) * (double)local_48;
  auVar3 = ZEXT864((ulong)local_60);
  local_68 = 0;
  local_40 = param_1;
  local_34 = param_7;
  local_30 = param_6;
  local_24 = param_5;
  local_20 = param_4;
  local_14 = param_3;
  local_10 = param_2;
  for (local_6c = 0; local_6c < local_48; local_6c = local_6c + 1) {
    local_64 = local_68;
    if (local_6c == local_48 + -1) {
      local_158 = local_14;
    }
    else {
      local_78 = ((double)(local_6c + 1) - local_60) / local_58;
      auVar3 = ZEXT864((ulong)local_78);
      ppVar1 = std::
               lower_bound<std::pair<int,int>const*,double,alex::fanout_tree::compute_level<int,int,alex::AlexCompare>(std::pair<int,int>const*,int,alex::AlexNode<int,int>const*,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&,int,int,double,bool,bool,alex::AlexCompare)::_lambda(auto:1_const&,auto:2_const&)_1_>
                         (local_10,local_10 + (long)local_14 * 8,&local_78);
      local_158 = (int)((long)ppVar1 - local_10 >> 3);
    }
    local_68 = local_158;
    while( true ) {
      uVar6 = false;
      if (local_68 < local_14) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_58;
        auVar2._0_8_ = (double)*(int *)(local_10 + (long)local_68 * 8);
        auVar2._8_8_ = auVar3._8_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_60;
        auVar2 = vfmadd213sd_fma(auVar2,auVar4,auVar5);
        auVar3 = ZEXT1664(auVar2);
        uVar6 = (int)auVar2._0_8_ <= local_6c;
      }
      if ((bool)uVar6 == false) break;
      local_68 = local_68 + 1;
    }
    if (local_64 == local_68) {
      in_stack_fffffffffffffe98 = local_30;
      memset(&local_c8,0,0x44);
      local_c8 = local_34;
      local_c4 = local_6c;
      in_stack_ffffffffffffff4c = local_68;
      std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::push_back
                ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                 CONCAT17(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98);
      in_stack_ffffffffffffff48 = local_64;
    }
    else {
      LinearModel<int>::LinearModel((LinearModel<int> *)&stack0xffffffffffffff28);
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
      build_model(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
                  (bool)in_stack_ffffffffffffff1f);
      DataNodeStats::DataNodeStats((DataNodeStats *)&stack0xffffffffffffff18);
      local_f0 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 ::compute_expected_cost
                           (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                            in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57,
                            (DataNodeStats *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (param_8 < local_68 - local_64) {
        local_f0 = local_f0 + 20.0;
      }
      local_50 = (local_f0 * (double)(local_68 - local_64)) / (double)local_14 + local_50;
      auVar3 = ZEXT864(in_stack_ffffffffffffff30);
      std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::push_back
                ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                 CONCAT17(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98);
    }
  }
  return ((double)local_48 * 5e-07 * 208.0 * (double)local_24) / (double)local_14 + 20.0 + local_50;
}

Assistant:

double compute_level(const std::pair<T, P> values[], int num_keys,
                     const AlexNode<T, P>* node, int total_keys,
                     std::vector<FTNode>& used_fanout_tree_nodes, int level,
                     int max_data_node_keys, double expected_insert_frac = 0,
                     bool approximate_model_computation = true,
                     bool approximate_cost_computation = false,
                     Compare key_less = Compare()) {
  int fanout = 1 << level;
  double cost = 0.0;
  double a = node->model_.a_ * fanout;
  double b = node->model_.b_ * fanout;
  int left_boundary = 0;
  int right_boundary = 0;
  for (int i = 0; i < fanout; i++) {
    left_boundary = right_boundary;
    right_boundary =
        i == fanout - 1
            ? num_keys
            : static_cast<int>(
                  std::lower_bound(values, values + num_keys, ((i + 1) - b) / a,
                                   [key_less](auto const& a, auto const& b) {
                                     return key_less(a.first, b);
                                   }) -
                  values);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < num_keys &&
           static_cast<int>(a * values[right_boundary].first + b) <= i) {
      right_boundary++;
    }
    if (left_boundary == right_boundary) {
      used_fanout_tree_nodes.push_back(
          {level, i, 0, left_boundary, right_boundary, false, 0, 0, 0, 0, 0});
      continue;
    }
    LinearModel<T> model;
    AlexDataNode<T, P>::build_model(values + left_boundary,
                                    right_boundary - left_boundary, &model,
                                    approximate_model_computation);

    DataNodeStats stats;
    double node_cost = AlexDataNode<T, P>::compute_expected_cost(
        values + left_boundary, right_boundary - left_boundary,
        AlexDataNode<T, P>::kInitDensity_, expected_insert_frac, &model,
        approximate_cost_computation, &stats);
    // If the node is too big to be a data node, proactively incorporate an
    // extra tree traversal level into the cost.
    if (right_boundary - left_boundary > max_data_node_keys) {
      node_cost += kNodeLookupsWeight;
    }

    cost += node_cost * (right_boundary - left_boundary) / num_keys;

    used_fanout_tree_nodes.push_back(
        {level, i, node_cost, left_boundary, right_boundary, false,
         stats.num_search_iterations, stats.num_shifts, model.a_, model.b_,
         right_boundary - left_boundary});
  }
  double traversal_cost =
      kNodeLookupsWeight +
      (kModelSizeWeight * fanout *
       (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
  cost += traversal_cost;
  return cost;
}